

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.cc
# Opt level: O0

int DSA_generate_key(DSA *a)

{
  BIGNUM *mod;
  BIGNUM *a_00;
  BIGNUM *m;
  bool bVar1;
  int iVar2;
  pointer pbVar3;
  BN_MONT_CTX **pmont;
  CRYPTO_MUTEX *lock;
  BN_MONT_CTX *pBVar4;
  BIGNUM *local_38;
  BIGNUM *priv_key;
  BIGNUM *pub_key;
  int ok;
  UniquePtr<BN_CTX> ctx;
  DSA *dsa_local;
  
  ctx._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl =
       (__uniq_ptr_data<bignum_ctx,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<bignum_ctx,_bssl::internal::Deleter,_true,_true>)a;
  iVar2 = dsa_check_key((DSA *)a);
  if (iVar2 == 0) {
    dsa_local._4_4_ = 0;
  }
  else {
    pbVar3 = (pointer)BN_CTX_new();
    std::unique_ptr<bignum_ctx,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<bignum_ctx,bssl::internal::Deleter> *)&ok,pbVar3);
    bVar1 = std::operator==((unique_ptr<bignum_ctx,_bssl::internal::Deleter> *)&ok,(nullptr_t)0x0);
    if (bVar1) {
      dsa_local._4_4_ = 0;
    }
    else {
      pub_key._0_4_ = 0;
      priv_key = (BIGNUM *)0x0;
      local_38 = *(BIGNUM **)
                  ((long)ctx._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl + 0x20);
      if ((((local_38 != (BIGNUM *)0x0) || (local_38 = BN_new(), local_38 != (BIGNUM *)0x0)) &&
          (iVar2 = BN_rand_range_ex((BIGNUM *)local_38,1,
                                    *(BIGNUM **)
                                     ((long)ctx._M_t.
                                            super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>
                                            .super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl
                                     + 8)), iVar2 != 0)) &&
         ((priv_key = *(BIGNUM **)
                       ((long)ctx._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>.
                              _M_t.super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl + 0x18),
          priv_key != (BIGNUM *)0x0 ||
          (priv_key = (BIGNUM *)BN_new(), (BIGNUM *)priv_key != (BIGNUM *)0x0)))) {
        pmont = (BN_MONT_CTX **)
                ((long)ctx._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl + 0x60);
        lock = (CRYPTO_MUTEX *)
               ((long)ctx._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl + 0x28);
        mod = *(BIGNUM **)
               ctx._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl;
        pbVar3 = std::unique_ptr<bignum_ctx,_bssl::internal::Deleter>::get
                           ((unique_ptr<bignum_ctx,_bssl::internal::Deleter> *)&ok);
        pBVar4 = BN_MONT_CTX_set_locked(pmont,lock,mod,pbVar3);
        if ((int)pBVar4 != 0) {
          a_00 = *(BIGNUM **)
                  ((long)ctx._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl + 0x10);
          m = *(BIGNUM **)
               ctx._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl;
          pbVar3 = std::unique_ptr<bignum_ctx,_bssl::internal::Deleter>::get
                             ((unique_ptr<bignum_ctx,_bssl::internal::Deleter> *)&ok);
          iVar2 = BN_mod_exp_mont_consttime
                            ((BIGNUM *)priv_key,a_00,local_38,m,(BN_CTX *)pbVar3,
                             *(BN_MONT_CTX **)
                              ((long)ctx._M_t.
                                     super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t
                                     .super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl + 0x60)
                            );
          if (iVar2 != 0) {
            bn_declassify(priv_key);
            *(BIGNUM **)
             ((long)ctx._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl + 0x20) = local_38;
            *(BIGNUM **)
             ((long)ctx._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl + 0x18) = priv_key;
            pub_key._0_4_ = 1;
          }
        }
      }
      if (*(long *)((long)ctx._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl + 0x18) == 0) {
        BN_free((BIGNUM *)priv_key);
      }
      if (*(long *)((long)ctx._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl + 0x20) == 0) {
        BN_free(local_38);
      }
      dsa_local._4_4_ = (int)pub_key;
    }
    std::unique_ptr<bignum_ctx,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<bignum_ctx,_bssl::internal::Deleter> *)&ok);
  }
  return dsa_local._4_4_;
}

Assistant:

int DSA_generate_key(DSA *dsa) {
  if (!dsa_check_key(dsa)) {
    return 0;
  }

  bssl::UniquePtr<BN_CTX> ctx(BN_CTX_new());
  if (ctx == nullptr) {
    return 0;
  }

  int ok = 0;
  BIGNUM *pub_key = nullptr;
  BIGNUM *priv_key = dsa->priv_key;
  if (priv_key == nullptr) {
    priv_key = BN_new();
    if (priv_key == nullptr) {
      goto err;
    }
  }

  if (!BN_rand_range_ex(priv_key, 1, dsa->q)) {
    goto err;
  }

  pub_key = dsa->pub_key;
  if (pub_key == nullptr) {
    pub_key = BN_new();
    if (pub_key == nullptr) {
      goto err;
    }
  }

  if (!BN_MONT_CTX_set_locked(&dsa->method_mont_p, &dsa->method_mont_lock,
                              dsa->p, ctx.get()) ||
      !BN_mod_exp_mont_consttime(pub_key, dsa->g, priv_key, dsa->p, ctx.get(),
                                 dsa->method_mont_p)) {
    goto err;
  }

  // The public key is computed from the private key, but is public.
  bn_declassify(pub_key);

  dsa->priv_key = priv_key;
  dsa->pub_key = pub_key;
  ok = 1;

err:
  if (dsa->pub_key == nullptr) {
    BN_free(pub_key);
  }
  if (dsa->priv_key == nullptr) {
    BN_free(priv_key);
  }

  return ok;
}